

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O0

string * ConnectionTypeAsString_abi_cxx11_(ConnectionType conn_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *psVar1;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_ESI;
  psVar1 = in_RDI;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_9);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_c);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_a);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_b);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_e);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/connection_types.cpp"
                  ,0x19,"std::string ConnectionTypeAsString(ConnectionType)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return psVar1;
}

Assistant:

std::string ConnectionTypeAsString(ConnectionType conn_type)
{
    switch (conn_type) {
    case ConnectionType::INBOUND:
        return "inbound";
    case ConnectionType::MANUAL:
        return "manual";
    case ConnectionType::FEELER:
        return "feeler";
    case ConnectionType::OUTBOUND_FULL_RELAY:
        return "outbound-full-relay";
    case ConnectionType::BLOCK_RELAY:
        return "block-relay-only";
    case ConnectionType::ADDR_FETCH:
        return "addr-fetch";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}